

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O0

cmListFileBacktrace * __thiscall
cmDebugger_impl::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmDebugger_impl *this)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_00;
  cmDebugger_impl *this_local;
  cmListFileBacktrace *empty;
  
  pcVar1 = cmake::GetGlobalGenerator(this->CMakeInstance);
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace(__return_storage_ptr__);
  }
  else {
    pcVar1 = cmake::GetGlobalGenerator(this->CMakeInstance);
    this_00 = cmGlobalGenerator::GetCurrentMakefile(pcVar1);
    cmMakefile::GetBacktrace(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace GetBacktrace() const override
  {
    if (this->CMakeInstance.GetGlobalGenerator()) {
      return this->CMakeInstance.GetGlobalGenerator()
        ->GetCurrentMakefile()
        ->GetBacktrace();
    }

    cmListFileBacktrace empty;
    return empty;
  }